

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void BeginDrawing(void)

{
  float16 result;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  CORE.Time.current = glfwGetTime();
  CORE.Time.update = CORE.Time.current - CORE.Time.previous;
  CORE.Time.previous = CORE.Time.current;
  rlLoadIdentity();
  local_40 = CORE.Window.screenScale.m0;
  local_3c = CORE.Window.screenScale.m1;
  local_38 = CORE.Window.screenScale.m2;
  local_34 = CORE.Window.screenScale.m3;
  local_30 = CORE.Window.screenScale.m4;
  local_2c = CORE.Window.screenScale.m5;
  local_28 = CORE.Window.screenScale.m6;
  local_24 = CORE.Window.screenScale.m7;
  local_20 = CORE.Window.screenScale.m8;
  local_1c = CORE.Window.screenScale.m9;
  local_18 = CORE.Window.screenScale.m10;
  local_14 = CORE.Window.screenScale.m11;
  local_10 = CORE.Window.screenScale.m12;
  local_c = CORE.Window.screenScale.m13;
  local_8 = CORE.Window.screenScale.m14;
  local_4 = CORE.Window.screenScale.m15;
  rlMultMatrixf(&local_40);
  return;
}

Assistant:

void BeginDrawing(void)
{
    // WARNING: Previously to BeginDrawing() other render textures drawing could happen,
    // consequently the measure for update vs draw is not accurate (only the total frame time is accurate)

    CORE.Time.current = GetTime();      // Number of elapsed seconds since InitTimer()
    CORE.Time.update = CORE.Time.current - CORE.Time.previous;
    CORE.Time.previous = CORE.Time.current;

    rlLoadIdentity();                   // Reset current matrix (modelview)
    rlMultMatrixf(MatrixToFloat(CORE.Window.screenScale)); // Apply screen scaling

    //rlTranslatef(0.375, 0.375, 0);    // HACK to have 2D pixel-perfect drawing on OpenGL 1.1
                                        // NOTE: Not required with OpenGL 3.3+
}